

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitSectors.cpp
# Opt level: O3

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::track_for_sectors
          (Disk *this,uint8_t *source,int number_of_sectors,uint8_t track,uint8_t side,
          uint8_t first_sector,uint8_t size,Density density)

{
  pointer *ppvVar1;
  iterator __position;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar2;
  pointer pSVar3;
  uint8_t *puVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Storage::Disk::Track> sVar5;
  optional<unsigned_long> sector_gap_length;
  vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_> sectors;
  vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_> local_58
  ;
  MFM *local_38;
  
  local_58.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < number_of_sectors) {
    local_38 = (MFM *)this;
    do {
      std::vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
      ::emplace_back<>(&local_58);
      local_58.
      super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].address.track = track;
      local_58.
      super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].address.side = side;
      local_58.
      super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].address.sector = first_sector;
      local_58.
      super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].size = size;
      pSVar3 = local_58.
               super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      __position._M_current =
           local_58.
           super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].samples.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          local_58.
          super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].samples.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::_M_realloc_insert<>(&pSVar3->samples,__position);
      }
      else {
        ((__position._M_current)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position._M_current)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppvVar1 = &local_58.
                   super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].samples.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      pvVar2 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
               (pSVar3->samples).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = source + (0x80 << (size & 0x1f));
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>(pvVar2,*(undefined8 *)pvVar2,source);
      this = (Disk *)local_38;
      first_sector = first_sector + '\x01';
      number_of_sectors = number_of_sectors + -1;
      source = source + (0x80 << (size & 0x1f));
    } while (number_of_sectors != 0);
    if (local_58.
        super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = 0;
      sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)puVar4;
      Encodings::MFM::TrackWithSectors
                (local_38,density,&local_58,sector_gap_length,(optional<unsigned_char>)0x0);
      goto LAB_00439db8;
    }
  }
  *this = (_func_int **)0x0;
  *(_func_int ***)((long)this + 8) = (_func_int **)0x0;
LAB_00439db8:
  std::vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>::
  ~vector(&local_58);
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> Storage::Disk::track_for_sectors(
	const uint8_t *const source,
	int number_of_sectors,
	uint8_t track,
	uint8_t side,
	uint8_t first_sector,
	uint8_t size,
	Storage::Encodings::MFM::Density density
) {
	std::vector<Storage::Encodings::MFM::Sector> sectors;

	size_t byte_size = size_t(128 << size);
	size_t source_pointer = 0;
	for(int sector = 0; sector < number_of_sectors; sector++) {
		sectors.emplace_back();

		Storage::Encodings::MFM::Sector &new_sector = sectors.back();
		new_sector.address.track = track;
		new_sector.address.side = side;
		new_sector.address.sector = first_sector;
		first_sector++;
		new_sector.size = size;

		new_sector.samples.emplace_back();
		new_sector.samples[0].insert(new_sector.samples[0].begin(), source + source_pointer, source + source_pointer + byte_size);
		source_pointer += byte_size;
	}

	if(!sectors.empty()) {
		return TrackWithSectors(density, sectors);
	}

	return nullptr;
}